

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O1

bool duckdb::SubtractPropagateStatistics::Operation<int,duckdb::TrySubtractOperator>
               (LogicalType *type,BaseStatistics *lstats,BaseStatistics *rstats,Value *new_min,
               Value *new_max)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long value;
  int64_t iVar5;
  Value local_70;
  
  iVar1 = NumericStats::GetMin<int>(lstats);
  iVar2 = NumericStats::GetMax<int>(rstats);
  lVar4 = (long)iVar1 - (long)iVar2;
  iVar5 = 1;
  if ((int)lVar4 == lVar4) {
    iVar1 = NumericStats::GetMax<int>(lstats);
    iVar2 = NumericStats::GetMin<int>(rstats);
    iVar3 = (int)((long)iVar1 - (long)iVar2);
    if ((long)iVar3 == (long)iVar1 - (long)iVar2) {
      iVar5 = 0;
      value = (long)(int)lVar4;
      if (lVar4 + 0x80000000U >> 0x20 != 0) {
        value = iVar5;
      }
      Value::Numeric(&local_70,type,value);
      Value::operator=(new_min,&local_70);
      Value::~Value(&local_70);
      Value::Numeric(&local_70,type,(long)iVar3);
      Value::operator=(new_max,&local_70);
      Value::~Value(&local_70);
    }
  }
  return SUB81(iVar5,0);
}

Assistant:

static bool Operation(const LogicalType &type, BaseStatistics &lstats, BaseStatistics &rstats, Value &new_min,
	                      Value &new_max) {
		T min, max;
		if (!OP::Operation(NumericStats::GetMin<T>(lstats), NumericStats::GetMax<T>(rstats), min)) {
			return true;
		}
		if (!OP::Operation(NumericStats::GetMax<T>(lstats), NumericStats::GetMin<T>(rstats), max)) {
			return true;
		}
		new_min = Value::Numeric(type, min);
		new_max = Value::Numeric(type, max);
		return false;
	}